

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O1

void nn_bws_start_accepting(nn_bws *self)

{
  nn_aws *self_00;
  
  if (self->aws == (nn_aws *)0x0) {
    self_00 = (nn_aws *)nn_alloc_(0x1b80);
    self->aws = self_00;
    if (self_00 != (nn_aws *)0x0) {
      nn_aws_init(self_00,2,self->ep,&self->fsm);
      nn_aws_start(self->aws,&self->usock);
      return;
    }
  }
  else {
    nn_bws_start_accepting_cold_1();
  }
  nn_bws_start_accepting_cold_2();
}

Assistant:

static void nn_bws_start_accepting (struct nn_bws *self)
{
    nn_assert (self->aws == NULL);

    /*  Allocate new aws state machine. */
    self->aws = nn_alloc (sizeof (struct nn_aws), "aws");
    alloc_assert (self->aws);
    nn_aws_init (self->aws, NN_BWS_SRC_AWS, self->ep, &self->fsm);

    /*  Start waiting for a new incoming connection. */
    nn_aws_start (self->aws, &self->usock);
}